

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRangeDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32 rank;
  bool bVar1;
  Type *pTVar2;
  allocator local_82;
  allocator local_81;
  undefined1 local_80 [40];
  string local_58;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    validateInputCount((Result *)local_80,layer,0,0);
  }
  else {
    validateInputCount((Result *)local_80,layer,1,3);
  }
  Result::operator=(__return_storage_ptr__,(Result *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_80,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  if (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
    rank = pTVar2->rank_;
    std::__cxx11::string::string((string *)&local_38,"Range",&local_81);
    std::__cxx11::string::string((string *)&local_58,"output",&local_82);
    checkRank((Result *)local_80,layer,&local_38,1,1,&local_58,rank);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRangeDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (layer.input_size() > 0) {
        r = validateInputCount(layer, 1, 3);
    } else {
        r = validateInputCount(layer, 0, 0);
    }
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (layer.outputtensor_size() > 0) {
        int rank = static_cast<int>(layer.outputtensor(0).rank());
        r =  checkRank(layer, "Range", 1, 1, "output", rank);
    }

    return r;
}